

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

bool __thiscall AActor::InStateSequence(AActor *this,FState *newstate,FState *basestate)

{
  FState **ppFVar1;
  FState *pFVar2;
  bool bVar3;
  
  if (basestate == (FState *)0x0) {
    return false;
  }
  do {
    bVar3 = basestate == newstate;
    if (bVar3) {
      return bVar3;
    }
    ppFVar1 = &basestate->NextState;
    pFVar2 = basestate + 1;
    basestate = *ppFVar1;
  } while (*ppFVar1 == pFVar2);
  return bVar3;
}

Assistant:

bool AActor::InStateSequence(FState * newstate, FState * basestate)
{
	if (basestate == NULL) return false;

	FState * thisstate = basestate;
	do
	{
		if (newstate == thisstate) return true;
		basestate = thisstate;
		thisstate = thisstate->GetNextState();
	}
	while (thisstate == basestate+1);
	return false;
}